

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O0

void __thiscall
write_point_ini::operator()(write_point_ini *this,way_point_le *point,xr_ini_writer *w,uint32_t id)

{
  char **ppcVar1;
  size_t __n;
  void *__buf;
  string local_d8 [36];
  int local_b4;
  char **ppcStack_b0;
  int n;
  char *buf;
  char buffer [128];
  uint32_t id_local;
  xr_ini_writer *w_local;
  way_point_le *point_local;
  write_point_ini *this_local;
  
  ppcStack_b0 = &buf;
  __n = (size_t)id;
  buffer._124_4_ = id;
  local_b4 = snprintf((char *)ppcStack_b0,0x80,"wp_%d_flags");
  if (0 < local_b4) {
    xray_re::xr_ini_writer::write
              (w,(int)ppcStack_b0,(void *)(ulong)(point->super_way_point).flags,__n);
  }
  local_b4 = snprintf((char *)ppcStack_b0,0x80,"wp_%d_name");
  ppcVar1 = ppcStack_b0;
  if (0 < local_b4) {
    std::__cxx11::string::string(local_d8,(string *)point);
    xray_re::xr_ini_writer::write(w,(int)ppcVar1,local_d8,0);
    std::__cxx11::string::~string(local_d8);
  }
  local_b4 = snprintf((char *)ppcStack_b0,0x80,"wp_%d_pos",(ulong)(uint)buffer._124_4_);
  if (0 < local_b4) {
    xray_re::xr_ini_writer::write
              (w,(int)ppcStack_b0,__buf,
               (ulong)(uint)(point->super_way_point).position.field_0.field_0.z);
  }
  local_b4 = snprintf((char *)ppcStack_b0,0x80,"wp_%d_selected");
  if (0 < local_b4) {
    xray_re::xr_ini_writer::write(w,(int)ppcStack_b0,"off",0);
  }
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_ini_writer* w, uint32_t id) const {
	char buffer[128];
	char* buf = &buffer[0];
	int n = xr_snprintf(buf, sizeof(buffer), "wp_%d_flags", id);
	if (n > 0)
		w->write(buf, point.flags);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_name", id);
	if (n > 0)
		w->write(buf, point.name, false);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_pos", id);
	if (n > 0)
		w->write(buf, point.position);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_selected", id);
	if (n > 0)
		w->write(buf, "off", false);
}